

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_literals.cpp
# Opt level: O3

spv_result_t spvtools::val::LiteralsPass(ValidationState_t *_,Instruction *inst)

{
  uint uVar1;
  bool bVar2;
  pointer psVar3;
  sbyte sVar4;
  uint uVar5;
  long lVar6;
  DiagnosticStream local_1f0;
  
  psVar3 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(inst->operands_).
                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)psVar3;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 4;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    do {
      if ((psVar3->number_kind - SPV_NUMBER_UNSIGNED_INT < 3) &&
         (uVar5 = psVar3->number_bit_width & 0x1f, uVar5 != 0)) {
        uVar1 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start
                [(ulong)psVar3->offset + ((ulong)psVar3->num_words - 1)];
        sVar4 = (sbyte)uVar5;
        uVar5 = -1 << sVar4;
        if (psVar3->number_kind == SPV_NUMBER_SIGNED_INT) {
          bVar2 = uVar5 <= uVar1;
          if ((uVar1 >> ((byte)(sVar4 - 1) & 0x1f) & 1) == 0) {
            bVar2 = (uVar5 & uVar1) == 0;
          }
          if (!bVar2) {
LAB_0018a3ad:
            ValidationState_t::diag(&local_1f0,_,SPV_ERROR_INVALID_VALUE,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1f0,
                       "The high-order bits of a literal number in instruction <id> ",0x3c);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1f0," must be 0 for a floating-point type, ",0x26);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1f0,"or 0 for an integer type with Signedness of 0, ",0x2f)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1f0,"or sign extended when Signedness is 1",0x25);
            DiagnosticStream::~DiagnosticStream(&local_1f0);
            return local_1f0.error_;
          }
        }
        else if ((uVar5 & uVar1) != 0) goto LAB_0018a3ad;
      }
      psVar3 = psVar3 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t LiteralsPass(ValidationState_t& _, const Instruction* inst) {
  // For every operand that is a literal number
  for (size_t i = 0; i < inst->operands().size(); i++) {
    const spv_parsed_operand_t& operand = inst->operand(i);
    if (!IsLiteralNumber(operand)) continue;

    // The upper bits are always in the last word (little-endian)
    int last_index = operand.offset + operand.num_words - 1;
    const uint32_t upper_word = inst->word(last_index);

    // TODO(jcaraban): is the |word size| defined in some header?
    const uint32_t word_size = 32;
    uint32_t bit_width = operand.number_bit_width;

    // Bit widths that are a multiple of the word size have no upper bits
    const auto remaining_value_bits = bit_width % word_size;
    if (remaining_value_bits == 0) continue;

    const bool signedness = operand.number_kind == SPV_NUMBER_SIGNED_INT;

    if (!VerifyUpperBits(upper_word, remaining_value_bits, signedness)) {
      return _.diag(SPV_ERROR_INVALID_VALUE, inst)
             << "The high-order bits of a literal number in instruction <id> "
             << inst->id() << " must be 0 for a floating-point type, "
             << "or 0 for an integer type with Signedness of 0, "
             << "or sign extended when Signedness is 1";
    }
  }
  return SPV_SUCCESS;
}